

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O2

void __thiscall
rengine::SDLBackend::sendPointerEvent(SDLBackend *this,SDL_Event *sdlEvent,Type type)

{
  int iVar1;
  Uint32 UVar2;
  uint uVar3;
  undefined1 local_68 [8];
  PointerEvent pe;
  
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x98,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  UVar2 = SDL_GetWindowID();
  if (UVar2 == (sdlEvent->display).display) {
    if (this->m_surface != (Surface *)0x0) {
      PointerEvent::PointerEvent((PointerEvent *)local_68,type);
      iVar1 = (sdlEvent->window).data2;
      pe.m_posInSurface.y = (float)(sdlEvent->motion).y;
      uVar3 = devicePixelRatio(this);
      pe.super_Event._vptr_Event._4_4_ = (float)iVar1 * (float)uVar3;
      pe.super_Event.m_type = (Type)(pe.m_posInSurface.y * (float)uVar3);
      pe.super_Event._12_4_ = pe.super_Event._vptr_Event._4_4_;
      pe._16_4_ = pe.super_Event.m_type;
      (*this->m_surface->_vptr_Surface[3])(this->m_surface,(PointerEvent *)local_68);
      return;
    }
    __assert_fail("m_surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x9a,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  __assert_fail("SDL_GetWindowID(m_window) == sdlEvent->button.windowID",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                ,0x99,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
}

Assistant:

inline void SDLBackend::sendPointerEvent(SDL_Event *sdlEvent, Event::Type type)
{
    assert(m_window);
    assert(SDL_GetWindowID(m_window) == sdlEvent->button.windowID);
    assert(m_surface);

    PointerEvent pe(type);
    pe.initialize(vec2(sdlEvent->button.x, sdlEvent->button.y) * devicePixelRatio());
    m_surface->onEvent(&pe);
}